

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_2(QPDF *pdf,char *arg2)

{
  ostream *poVar1;
  element_type *peVar2;
  undefined1 local_318 [8];
  shared_ptr<Pl_StdioFile> out;
  string local_300 [32];
  undefined1 local_2e0 [8];
  QPDFObjectHandle contents;
  QPDFObjectHandle page;
  string local_2b8 [32];
  undefined1 local_298 [8];
  QPDFObjectHandle kids;
  string local_280 [32];
  undefined1 local_260 [8];
  QPDFObjectHandle pages;
  QPDFObjectHandle root;
  string local_238 [32];
  QPDFObjectHandle local_218;
  string local_208 [39];
  allocator<char> local_1e1;
  string local_1e0 [32];
  QPDFObjectHandle local_1c0;
  string local_1b0 [39];
  allocator<char> local_189;
  string local_188 [32];
  undefined1 local_168 [8];
  QPDFObjectHandle encrypt;
  string local_150 [39];
  allocator<char> local_129;
  string local_128 [32];
  QPDFObjectHandle local_108;
  QPDFObjectHandle local_f8;
  string local_e8 [39];
  allocator<char> local_c1;
  string local_c0 [55];
  allocator<char> local_89;
  string local_88 [32];
  QPDFObjectHandle local_68;
  QPDFObjectHandle local_58;
  string local_48 [32];
  undefined1 local_28 [8];
  QPDFObjectHandle trailer;
  char *arg2_local;
  QPDF *pdf_local;
  
  trailer.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg2;
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,"/Info",&local_89);
  QPDFObjectHandle::getKey((string *)&local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"/CreationDate",&local_c1);
  QPDFObjectHandle::getKey((string *)&local_58);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  poVar1 = std::operator<<((ostream *)&std::cout,local_48);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_48);
  QPDFObjectHandle::~QPDFObjectHandle(&local_58);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  QPDFObjectHandle::~QPDFObjectHandle(&local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_128,"/Info",&local_129);
  QPDFObjectHandle::getKey((string *)&local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_150,"/Producer",
             (allocator<char> *)
             ((long)&encrypt.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((string *)&local_f8);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  poVar1 = std::operator<<((ostream *)&std::cout,local_e8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_e8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_f8);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&encrypt.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::~QPDFObjectHandle(&local_108);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_188,"/Encrypt",&local_189);
  QPDFObjectHandle::getKey((string *)local_168);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"/O",&local_1e1);
  QPDFObjectHandle::getKey((string *)&local_1c0);
  QPDFObjectHandle::unparse_abi_cxx11_();
  poVar1 = std::operator<<((ostream *)&std::cout,local_1b0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1b0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_1c0);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_238,"/U",
             (allocator<char> *)
             ((long)&root.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((string *)&local_218);
  QPDFObjectHandle::unparse_abi_cxx11_();
  poVar1 = std::operator<<((ostream *)&std::cout,local_208);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_208);
  QPDFObjectHandle::~QPDFObjectHandle(&local_218);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&root.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDF::getRoot();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_280,"/Pages",
             (allocator<char> *)
             ((long)&kids.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((string *)local_260);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&kids.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2b8,"/Kids",
             (allocator<char> *)
             ((long)&page.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((string *)local_298);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&page.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getArrayItem((int)&contents + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_300,"/Contents",
             (allocator<char> *)
             ((long)&out.super___shared_ptr<Pl_StdioFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  QPDFObjectHandle::getKey((string *)local_2e0);
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&out.super___shared_ptr<Pl_StdioFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  QUtil::binary_stdout();
  std::make_shared<Pl_StdioFile,char_const(&)[9],_IO_FILE*&>
            ((char (*) [9])local_318,(_IO_FILE **)"filtered");
  peVar2 = std::__shared_ptr<Pl_StdioFile,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<Pl_StdioFile,_(__gnu_cxx::_Lock_policy)2> *)local_318);
  QPDFObjectHandle::pipeStreamData((Pipeline *)local_2e0,(int)peVar2,qpdf_dl_none,true,false);
  std::shared_ptr<Pl_StdioFile>::~shared_ptr((shared_ptr<Pl_StdioFile> *)local_318);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_2e0);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &contents.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_298);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_260);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &pages.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_168);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
  return;
}

Assistant:

static void
test_2(QPDF& pdf, char const* arg2)
{
    // Encrypted file.  This test case is designed for a specific
    // PDF file.

    QPDFObjectHandle trailer = pdf.getTrailer();
    std::cout << trailer.getKey("/Info").getKey("/CreationDate").getStringValue() << std::endl;
    std::cout << trailer.getKey("/Info").getKey("/Producer").getStringValue() << std::endl;

    QPDFObjectHandle encrypt = trailer.getKey("/Encrypt");
    std::cout << encrypt.getKey("/O").unparse() << std::endl;
    std::cout << encrypt.getKey("/U").unparse() << std::endl;

    QPDFObjectHandle root = pdf.getRoot();
    QPDFObjectHandle pages = root.getKey("/Pages");
    QPDFObjectHandle kids = pages.getKey("/Kids");
    QPDFObjectHandle page = kids.getArrayItem(1); // second page
    QPDFObjectHandle contents = page.getKey("/Contents");
    QUtil::binary_stdout();
    auto out = std::make_shared<Pl_StdioFile>("filtered", stdout);
    contents.pipeStreamData(out.get(), 0, qpdf_dl_generalized);
}